

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O0

void __thiscall gss::innards::Proof::Proof(Proof *this,ProofOptions *options)

{
  pointer pIVar1;
  long in_RSI;
  pointer in_stack_ffffffffffffffa8;
  undefined6 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb6;
  byte bVar2;
  undefined1 in_stack_ffffffffffffffb7;
  
  operator_new(0x808);
  Imp::Imp((Imp *)this);
  std::unique_ptr<gss::innards::Proof::Imp,std::default_delete<gss::innards::Proof::Imp>>::
  unique_ptr<std::default_delete<gss::innards::Proof::Imp>,void>
            ((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )CONCAT17(in_stack_ffffffffffffffb7,
                       CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
             in_stack_ffffffffffffffa8);
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x19b65c);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffffb7,
                      CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
             &in_stack_ffffffffffffffa8->opb_filename);
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x19b683);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffffb7,
                      CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
             &in_stack_ffffffffffffffa8->opb_filename);
  bVar2 = *(byte *)(in_RSI + 0x41);
  pIVar1 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x19b6ac);
  pIVar1->super_extra_verbose = (bool)(bVar2 & 1);
  bVar2 = *(byte *)(in_RSI + 0x40);
  pIVar1 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x19b6cf);
  pIVar1->recover_encoding = (bool)(bVar2 & 1);
  return;
}

Assistant:

Proof::Proof(const ProofOptions & options) :
    _imp(new Imp)
{
    _imp->opb_filename = options.opb_file;
    _imp->log_filename = options.log_file;
    _imp->super_extra_verbose = options.super_extra_verbose;
    _imp->recover_encoding = options.recover_encoding;
}